

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

bool __thiscall spirv_cross::CompilerGLSL::variable_is_lut(CompilerGLSL *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t id;
  SPIRConstant *pSVar2;
  byte local_31;
  SPIRConstant *constant;
  SPIRVariable *pSStack_20;
  bool statically_assigned;
  SPIRVariable *var_local;
  CompilerGLSL *this_local;
  
  local_31 = 0;
  pSStack_20 = var;
  var_local = (SPIRVariable *)this;
  if ((var->statically_assigned & 1U) != 0) {
    TypedID<(spirv_cross::Types)0>::TypedID((TypedID<(spirv_cross::Types)0> *)&constant,0);
    bVar1 = TypedID<(spirv_cross::Types)0>::operator!=
                      (&var->static_expression,(TypedID<(spirv_cross::Types)0> *)&constant);
    local_31 = 0;
    if (bVar1) {
      local_31 = pSStack_20->remapped_variable;
    }
  }
  constant._7_1_ = local_31 & 1;
  if (constant._7_1_ != 0) {
    id = TypedID::operator_cast_to_unsigned_int((TypedID *)&pSStack_20->static_expression);
    pSVar2 = Compiler::maybe_get<spirv_cross::SPIRConstant>(&this->super_Compiler,id);
    if ((pSVar2 != (SPIRConstant *)0x0) && ((pSVar2->is_used_as_lut & 1U) != 0)) {
      return true;
    }
  }
  return false;
}

Assistant:

bool CompilerGLSL::variable_is_lut(const SPIRVariable &var) const
{
	bool statically_assigned = var.statically_assigned && var.static_expression != ID(0) && var.remapped_variable;

	if (statically_assigned)
	{
		auto *constant = maybe_get<SPIRConstant>(var.static_expression);
		if (constant && constant->is_used_as_lut)
			return true;
	}

	return false;
}